

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double calc_kurtosis_weighted<double,int,std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,int *Xc_ind,
                 int *Xc_indptr,MissingAction missing_action,
                 vector<double,_std::allocator<double>_> *w)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  bool bVar5;
  ulong *puVar6;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  long lVar14;
  long lVar15;
  double __z;
  double dVar16;
  double __z_00;
  double __z_01;
  double dVar17;
  double dVar18;
  double dVar19;
  double local_a0;
  
  lVar15 = (long)Xc_indptr[col_num];
  lVar14 = (long)Xc_indptr[col_num + 1];
  if (st <= end && Xc_indptr[col_num] != Xc_indptr[col_num + 1]) {
    dVar16 = 0.0;
    sVar10 = st;
    do {
      dVar16 = dVar16 + (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[ix_arr[sVar10]];
      sVar10 = sVar10 + 1;
    } while (sVar10 <= end);
    if (0.0 < dVar16) {
      puVar6 = ix_arr + st;
      puVar13 = ix_arr + end + 1;
      uVar8 = (long)puVar13 - (long)puVar6 >> 3;
      if (0 < (long)uVar8) {
        do {
          uVar9 = uVar8 >> 1;
          uVar11 = ~uVar9 + uVar8;
          uVar8 = uVar9;
          if (puVar6[uVar9] < (ulong)(long)Xc_ind[lVar15]) {
            puVar6 = puVar6 + uVar9 + 1;
            uVar8 = uVar11;
          }
        } while (0 < (long)uVar8);
      }
      iVar2 = Xc_ind[lVar14 + -1];
      if (missing_action == Fail) {
        if (lVar14 == lVar15 || puVar6 == puVar13) {
          return -INFINITY;
        }
        pdVar4 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        __z = 0.0;
        __z_00 = 0.0;
        local_a0 = 0.0;
        __z_01 = 0.0;
        while (uVar8 = *puVar6, uVar8 <= (ulong)(long)iVar2) {
          piVar1 = Xc_ind + lVar15;
          iVar3 = *piVar1;
          if (iVar3 == (int)uVar8) {
            dVar17 = pdVar4[uVar8];
            dVar18 = Xc[lVar15];
            dVar19 = dVar18 * dVar18;
            __z = fma(dVar17,dVar18,__z);
            __z_00 = fma(dVar17,dVar19,__z_00);
            local_a0 = fma(dVar17,dVar18 * dVar19,local_a0);
            __z_01 = fma(dVar17,dVar19 * dVar19,__z_01);
            if ((puVar6 == ix_arr + end) || (lVar15 == lVar14 + -1)) break;
            piVar7 = piVar1 + 1;
            puVar6 = puVar6 + 1;
            uVar8 = (long)Xc_ind + (lVar14 * 4 - (long)piVar7) >> 2;
            if (0 < (long)uVar8) {
              do {
                uVar9 = uVar8 >> 1;
                uVar11 = ~uVar9 + uVar8;
                uVar8 = uVar9;
                if ((ulong)(long)(piVar7 + uVar9 + 1)[-1] < *puVar6) {
                  piVar7 = piVar7 + uVar9 + 1;
                  uVar8 = uVar11;
                }
              } while (0 < (long)uVar8);
            }
LAB_00125f1a:
            lVar15 = (long)piVar7 - (long)Xc_ind >> 2;
          }
          else {
            if (iVar3 <= (int)uVar8) {
              piVar7 = piVar1 + 1;
              uVar9 = (long)Xc_ind + (lVar14 * 4 - (long)(piVar1 + 1)) >> 2;
              while (0 < (long)uVar9) {
                uVar11 = uVar9 >> 1;
                uVar12 = ~uVar11 + uVar9;
                uVar9 = uVar11;
                if ((ulong)(long)(piVar7 + uVar11 + 1)[-1] < uVar8) {
                  piVar7 = piVar7 + uVar11 + 1;
                  uVar9 = uVar12;
                }
              }
              goto LAB_00125f1a;
            }
            puVar6 = puVar6 + 1;
            uVar8 = (long)puVar13 - (long)puVar6 >> 3;
            while (0 < (long)uVar8) {
              uVar9 = uVar8 >> 1;
              uVar11 = ~uVar9 + uVar8;
              uVar8 = uVar9;
              if (puVar6[uVar9] < (ulong)(long)iVar3) {
                puVar6 = puVar6 + uVar9 + 1;
                uVar8 = uVar11;
              }
            }
          }
          if ((puVar6 == puVar13) || (lVar15 == lVar14)) break;
        }
      }
      else {
        if (lVar14 != lVar15 && puVar6 != puVar13) {
          pdVar4 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          __z = 0.0;
          __z_00 = 0.0;
          local_a0 = 0.0;
          __z_01 = 0.0;
          while (uVar8 = *puVar6, uVar8 <= (ulong)(long)iVar2) {
            piVar1 = Xc_ind + lVar15;
            iVar3 = *piVar1;
            if (iVar3 == (int)uVar8) {
              dVar17 = pdVar4[uVar8];
              dVar18 = Xc[lVar15];
              if ((ulong)ABS(dVar18) < 0x7ff0000000000000) {
                dVar19 = dVar18 * dVar18;
                __z = fma(dVar17,dVar18,__z);
                __z_00 = fma(dVar17,dVar19,__z_00);
                local_a0 = fma(dVar17,dVar18 * dVar19,local_a0);
                __z_01 = fma(dVar17,dVar19 * dVar19,__z_01);
              }
              else {
                dVar16 = dVar16 - dVar17;
              }
              if ((puVar6 == ix_arr + end) || (lVar15 == lVar14 + -1)) break;
              piVar7 = piVar1 + 1;
              puVar6 = puVar6 + 1;
              uVar8 = (long)Xc_ind + (lVar14 * 4 - (long)piVar7) >> 2;
              if (0 < (long)uVar8) {
                do {
                  uVar9 = uVar8 >> 1;
                  uVar11 = ~uVar9 + uVar8;
                  uVar8 = uVar9;
                  if ((ulong)(long)(piVar7 + uVar9 + 1)[-1] < *puVar6) {
                    piVar7 = piVar7 + uVar9 + 1;
                    uVar8 = uVar11;
                  }
                } while (0 < (long)uVar8);
              }
LAB_00126172:
              lVar15 = (long)piVar7 - (long)Xc_ind >> 2;
            }
            else {
              if (iVar3 <= (int)uVar8) {
                piVar7 = piVar1 + 1;
                uVar9 = (long)Xc_ind + (lVar14 * 4 - (long)(piVar1 + 1)) >> 2;
                while (0 < (long)uVar9) {
                  uVar11 = uVar9 >> 1;
                  uVar12 = ~uVar11 + uVar9;
                  uVar9 = uVar11;
                  if ((ulong)(long)(piVar7 + uVar11 + 1)[-1] < uVar8) {
                    piVar7 = piVar7 + uVar11 + 1;
                    uVar9 = uVar12;
                  }
                }
                goto LAB_00126172;
              }
              puVar6 = puVar6 + 1;
              uVar8 = (long)puVar13 - (long)puVar6 >> 3;
              while (0 < (long)uVar8) {
                uVar9 = uVar8 >> 1;
                uVar11 = ~uVar9 + uVar8;
                uVar8 = uVar9;
                if (puVar6[uVar9] < (ulong)(long)iVar3) {
                  puVar6 = puVar6 + uVar9 + 1;
                  uVar8 = uVar11;
                }
              }
            }
            if ((puVar6 == puVar13) || (lVar15 == lVar14)) break;
          }
        }
        else {
          __z_01 = 0.0;
          local_a0 = 0.0;
          __z_00 = 0.0;
          __z = 0.0;
        }
        if (dVar16 <= 0.0) {
          return -INFINITY;
        }
      }
      if ((1.0 < dVar16) && ((__z_00 != 0.0 || (NAN(__z_00))))) {
        if ((__z_00 != __z * __z) || (NAN(__z_00) || NAN(__z * __z))) {
          dVar19 = __z / dVar16;
          dVar17 = dVar19 * dVar19;
          dVar18 = __z_00 / dVar16 - dVar17;
          if ((!NAN(dVar18)) &&
             ((2.220446049250313e-16 < dVar18 ||
              (bVar5 = check_more_than_two_unique_values<double,int>
                                 (ix_arr,st,end,col_num,Xc_indptr,Xc_ind,Xc,missing_action), bVar5))
             )) {
            if (dVar18 <= 0.0) {
              return 0.0;
            }
            dVar16 = (dVar17 * dVar19 * dVar19 * dVar16 +
                     __z * -4.0 * dVar17 * dVar19 +
                     __z_00 * 6.0 * dVar17 + local_a0 * -4.0 * dVar19 + __z_01) /
                     (dVar18 * dVar18 * dVar16);
            if ((long)ABS(dVar16) < 0x7ff0000000000000) {
              if (dVar16 <= 0.0) {
                return 0.0;
              }
              return dVar16;
            }
            return -INFINITY;
          }
        }
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}